

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O1

reference __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::object_projection::evaluate
          (object_projection *this,reference val,
          eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          *context,error_code *ec)

{
  pointer ppeVar1;
  bool bVar2;
  int iVar3;
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *this_00;
  undefined4 extraout_var;
  reference pbVar4;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *item;
  __normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>
  _Var5;
  pointer ptr;
  expr_base_impl<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  **expression;
  pointer ppeVar6;
  value_type *local_58;
  const_object_range_type local_50;
  value_type *this_01;
  
  bVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_object(val)
  ;
  if (!bVar2) {
    pbVar4 = eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
             ::null_value(context);
    return pbVar4;
  }
  this_00 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
            eval_context<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
            ::create_json<jsoncons::json_array_arg_t_const&>
                      ((eval_context<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                        *)context,(json_array_arg_t *)&json_array_arg);
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_range_abi_cxx11_
            (&local_50,
             (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)val);
  _Var5._M_current = local_50.first_.it_._M_current;
  bVar2 = local_50.first_.has_value_ == local_50.last_.has_value_;
  if ((local_50.first_.has_value_ & local_50.last_.has_value_ & 1U) != 0) {
    bVar2 = local_50.first_.it_._M_current == local_50.last_.it_._M_current;
  }
  while (!bVar2) {
    this_01 = &(_Var5._M_current)->value_;
    bVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_null
                      (this_01);
    if (!bVar2) {
      ppeVar1 = (this->super_projection_base).expressions_.
                super__Vector_base<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::allocator<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppeVar6 = (this->super_projection_base).expressions_.
                     super__Vector_base<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::allocator<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppeVar6 != ppeVar1;
          ppeVar6 = ppeVar6 + 1) {
        iVar3 = (*((*ppeVar6)->
                  super_expr_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  )._vptr_expr_base[2])(*ppeVar6,this_01,context,ec);
        this_01 = (value_type *)CONCAT44(extraout_var,iVar3);
      }
      bVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_null
                        (this_01);
      if (!bVar2) {
        local_58 = this_01;
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        emplace_back<jsoncons::json_const_pointer_arg_t_const&,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>const*>
                  (this_00,(json_const_pointer_arg_t *)&json_const_pointer_arg,&local_58);
      }
    }
    _Var5._M_current = _Var5._M_current + 1;
    bVar2 = _Var5._M_current == local_50.last_.it_._M_current;
    if ((local_50.first_.has_value_ & local_50.last_.has_value_ & 1U) == 0) {
      bVar2 = local_50.first_.has_value_ == local_50.last_.has_value_;
    }
  }
  return (reference)this_00;
}

Assistant:

reference evaluate(reference val, eval_context<Json>& context, std::error_code& ec) const override
            {
                if (!val.is_object())
                {
                    return context.null_value();
                }

                auto result = context.create_json(json_array_arg);
                for (auto& item : val.object_range())
                {
                    if (!item.value().is_null())
                    {
                        reference j = this->apply_expressions(item.value(), context, ec);
                        if (!j.is_null())
                        {
                            result->emplace_back(json_const_pointer_arg, std::addressof(j));
                        }
                    }
                }
                return *result;
            }